

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemb_test.cc
# Opt level: O1

void anon_unknown.dwarf_2117e76::Dropout
               (TX_SIZE tx_size,TX_TYPE tx_type,int dropout_num_before,int dropout_num_after,
               tran_low_t *qcoeff_scan)

{
  int16_t *piVar1;
  undefined8 *puVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  undefined4 in_register_00000014;
  ulong uVar6;
  long lVar7;
  undefined7 in_register_00000031;
  undefined7 in_register_00000039;
  SEARCH_METHODS *pSVar8;
  unsigned_short uVar9;
  uint8_t txb_entropy_ctx [1];
  AssertionResult gtest_ar;
  uint16_t eobs [1];
  tran_low_t qcoeff [4096];
  tran_low_t dqcoeff [4096];
  MACROBLOCK mb;
  Message aMStack_2d720 [2];
  AssertHelper AStack_2d710;
  internal aiStack_2d708 [8];
  undefined8 *puStack_2d700;
  int iStack_2d6f8;
  int iStack_2d6f4;
  uint uStack_2d6f0;
  unsigned_short uStack_2d6ec;
  unsigned_short uStack_2d6ea;
  int aiStack_2d6e8 [4096];
  int aiStack_296e8 [4096];
  MACROBLOCK MStack_256e8;
  
  lVar7 = CONCAT44(in_register_00000014,dropout_num_before);
  iStack_2d6f8 = (int)CONCAT71(in_register_00000031,tx_type);
  uVar5 = 0x400;
  iStack_2d6f4 = (int)CONCAT71(in_register_00000039,tx_size);
  if (iStack_2d6f4 != 4) {
    uVar5 = (ulong)(uint)tx_size_2d[tx_size];
  }
  if (0 < (int)uVar5) {
    piVar1 = av1_scan_orders[tx_size][0].scan;
    uVar6 = 0;
    do {
      aiStack_2d6e8[piVar1[uVar6]] = *(int *)(lVar7 + uVar6 * 4);
      uVar6 = uVar6 + 1;
    } while (uVar5 != uVar6);
  }
  uStack_2d6f0 = 0x400;
  if (tx_size != '\x04') {
    uStack_2d6f0 = tx_size_2d[tx_size];
  }
  uVar5 = (ulong)uStack_2d6f0;
  if (0 < (int)uStack_2d6f0) {
    uVar6 = 0;
    do {
      aiStack_296e8[uVar6] = aiStack_2d6e8[uVar6] * 10;
      uVar6 = uVar6 + 1;
    } while (uVar5 != uVar6);
  }
  uVar9 = (unsigned_short)uStack_2d6f0;
  uVar4 = uStack_2d6f0;
  if (uVar9 != 0) {
    do {
      uVar9 = (unsigned_short)uVar4;
      if (*(int *)(lVar7 + (ulong)((uVar4 & 0xffff) - 1) * 4) != 0) goto LAB_0074590c;
      uVar4 = (uint)(ushort)(uVar9 - 1);
    } while ((unsigned_short)(uVar9 - 1) != 0);
    uVar9 = 0;
  }
LAB_0074590c:
  memset(&MStack_256e8,0,0x256b0);
  uStack_2d6ea = uVar9;
  av1_dropout_qcoeff_num(&MStack_256e8,0,0,tx_size,'\0',4,iStack_2d6f8);
  uVar3 = uStack_2d6f0;
  uVar4 = 0x400;
  if ((char)iStack_2d6f4 != '\x04') {
    uVar4 = tx_size_2d[tx_size];
  }
  if (0 < (int)uVar4) {
    piVar1 = av1_scan_orders[tx_size][0].scan;
    uVar6 = 0;
    do {
      *(int *)(lVar7 + uVar6 * 4) = aiStack_2d6e8[piVar1[uVar6]];
      uVar6 = uVar6 + 1;
    } while (uVar4 != uVar6);
  }
  uStack_2d6ec = (unsigned_short)uStack_2d6f0;
  uVar4 = uStack_2d6f0;
  if (uStack_2d6ec != 0) {
    do {
      uStack_2d6ec = (unsigned_short)uVar4;
      if (*(int *)(lVar7 + (ulong)((uVar4 & 0xffff) - 1) * 4) != 0) goto LAB_007459d7;
      uVar4 = (uint)(ushort)(uStack_2d6ec - 1);
    } while ((unsigned_short)(uStack_2d6ec - 1) != 0);
    uStack_2d6ec = 0;
  }
LAB_007459d7:
  testing::internal::CmpHelperEQ<unsigned_short,unsigned_short>
            (aiStack_2d708,"new_eob","mb.plane[kPlane].eobs[0]",&uStack_2d6ec,&uStack_2d6ea);
  if (aiStack_2d708[0] == (internal)0x0) {
    testing::Message::Message(aMStack_2d720);
    if (puStack_2d700 == (undefined8 *)0x0) {
      pSVar8 = "";
    }
    else {
      pSVar8 = (SEARCH_METHODS *)*puStack_2d700;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_2d710,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/encodemb_test.cc"
               ,0x53,(char *)pSVar8);
    testing::internal::AssertHelper::operator=(&AStack_2d710,aMStack_2d720);
    testing::internal::AssertHelper::~AssertHelper(&AStack_2d710);
    if ((long *)CONCAT44(aMStack_2d720[0].ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         (int)aMStack_2d720[0].ss_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(aMStack_2d720[0].ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     (int)aMStack_2d720[0].ss_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl) + 8))();
    }
  }
  puVar2 = puStack_2d700;
  if (puStack_2d700 != (undefined8 *)0x0) {
    if ((undefined8 *)*puStack_2d700 != puStack_2d700 + 2) {
      operator_delete((undefined8 *)*puStack_2d700);
    }
    operator_delete(puVar2);
  }
  if (0 < (int)uVar3) {
    lVar7 = 0;
    do {
      aMStack_2d720[0].ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ = *(int *)((long)aiStack_2d6e8 + lVar7) * 10;
      testing::internal::CmpHelperEQ<int,int>
                (aiStack_2d708,"qcoeff[i] * kDequantFactor","dqcoeff[i]",(int *)aMStack_2d720,
                 (int *)((long)aiStack_296e8 + lVar7));
      if (aiStack_2d708[0] == (internal)0x0) {
        testing::Message::Message(aMStack_2d720);
        pSVar8 = "";
        if (puStack_2d700 != (undefined8 *)0x0) {
          pSVar8 = (SEARCH_METHODS *)*puStack_2d700;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&AStack_2d710,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/encodemb_test.cc"
                   ,0x57,(char *)pSVar8);
        testing::internal::AssertHelper::operator=(&AStack_2d710,aMStack_2d720);
        testing::internal::AssertHelper::~AssertHelper(&AStack_2d710);
        if ((long *)CONCAT44(aMStack_2d720[0].ss_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._4_4_,
                             (int)aMStack_2d720[0].ss_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(aMStack_2d720[0].ss_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl._4_4_,
                                         (int)aMStack_2d720[0].ss_._M_t.
                                              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                              ._M_head_impl) + 8))();
        }
      }
      puVar2 = puStack_2d700;
      if (puStack_2d700 != (undefined8 *)0x0) {
        if ((undefined8 *)*puStack_2d700 != puStack_2d700 + 2) {
          operator_delete((undefined8 *)*puStack_2d700);
        }
        operator_delete(puVar2);
      }
      lVar7 = lVar7 + 4;
    } while (uVar5 << 2 != lVar7);
  }
  return;
}

Assistant:

void Dropout(TX_SIZE tx_size, TX_TYPE tx_type, int dropout_num_before,
             int dropout_num_after, tran_low_t *qcoeff_scan) {
  tran_low_t qcoeff[MAX_TX_SQUARE];
  // qcoeff_scan is assumed to be in scan order, since tests are easier to
  // understand this way, but av1_dropout_qcoeff expects coeffs in lexico order
  // so we convert to lexico then back to scan afterwards.
  ToLexicoOrder(tx_size, tx_type, qcoeff_scan, qcoeff);

  const int max_eob = av1_get_max_eob(tx_size);
  const int kDequantFactor = 10;
  tran_low_t dqcoeff[MAX_TX_SQUARE];
  for (int i = 0; i < max_eob; ++i) {
    dqcoeff[i] = qcoeff[i] * kDequantFactor;
  }

  uint16_t eob = max_eob;
  while (eob > 0 && qcoeff_scan[eob - 1] == 0) --eob;

  MACROBLOCK mb;
  const int kPlane = 0;
  const int kBlock = 0;
  memset(&mb, 0, sizeof(mb));
  uint16_t eobs[] = { eob };
  mb.plane[kPlane].eobs = eobs;
  mb.plane[kPlane].qcoeff = qcoeff;
  mb.plane[kPlane].dqcoeff = dqcoeff;
  uint8_t txb_entropy_ctx[1];
  mb.plane[kPlane].txb_entropy_ctx = txb_entropy_ctx;

  av1_dropout_qcoeff_num(&mb, kPlane, kBlock, tx_size, tx_type,
                         dropout_num_before, dropout_num_after);

  ToScanOrder(tx_size, tx_type, qcoeff, qcoeff_scan);

  // Check updated eob value is valid.
  uint16_t new_eob = max_eob;
  while (new_eob > 0 && qcoeff_scan[new_eob - 1] == 0) --new_eob;
  EXPECT_EQ(new_eob, mb.plane[kPlane].eobs[0]);

  // Check dqcoeff is still valid.
  for (int i = 0; i < max_eob; ++i) {
    EXPECT_EQ(qcoeff[i] * kDequantFactor, dqcoeff[i]);
  }
}